

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O0

asn_enc_rval_t *
OCTET_STRING_encode_xer_utf8
          (asn_TYPE_descriptor_t *td,void *sptr,int ilevel,xer_encoder_flags_e flags,
          asn_app_consume_bytes_f *cb,void *app_key)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  long *in_RDX;
  asn_TYPE_descriptor_s *in_RSI;
  asn_enc_rval_t *in_RDI;
  code *in_R9;
  undefined8 in_stack_00000008;
  asn_enc_rval_t *tmp_error;
  int s_len;
  uint ch;
  ssize_t encoded_len;
  uint8_t *ss;
  uint8_t *end;
  uint8_t *buf;
  asn_enc_rval_t er;
  OCTET_STRING_t *st;
  char *local_90;
  char *local_88;
  char *local_80;
  byte *local_60;
  byte *local_58;
  byte *local_48;
  
  local_60 = (byte *)0x0;
  if ((in_RDX == (long *)0x0) || ((*in_RDX == 0 && ((int)in_RDX[1] != 0)))) {
    in_RDI->encoded = -1;
    in_RDI->failed_type = in_RSI;
    in_RDI->structure_ptr = in_RDX;
    if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
      local_80 = "";
    }
    else {
      local_80 = in_RSI->name;
    }
    ASN_DEBUG("Failed to encode element %s",local_80);
  }
  else {
    local_58 = (byte *)*in_RDX;
    pbVar4 = local_58 + (int)in_RDX[1];
    for (local_48 = local_58; local_48 < pbVar4; local_48 = local_48 + 1) {
      uVar1 = (uint)*local_48;
      if ((uVar1 < 0x3f) && (iVar3 = OCTET_STRING__xer_escape_table[uVar1].size, iVar3 != 0)) {
        if (((local_48 != local_58) &&
            (iVar2 = (*in_R9)(local_58,(long)local_48 - (long)local_58,in_stack_00000008), iVar2 < 0
            )) || (iVar2 = (*in_R9)(OCTET_STRING__xer_escape_table[uVar1].string,(long)iVar3,
                                    in_stack_00000008), iVar2 < 0)) {
          in_RDI->encoded = -1;
          in_RDI->failed_type = in_RSI;
          in_RDI->structure_ptr = in_RDX;
          if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
            local_88 = "";
          }
          else {
            local_88 = in_RSI->name;
          }
          ASN_DEBUG("Failed to encode element %s",local_88);
          return in_RDI;
        }
        local_60 = local_48 + (long)(local_60 + ((long)iVar3 - (long)local_58));
        local_58 = local_48 + 1;
      }
    }
    if ((local_48 != local_58) &&
       (iVar3 = (*in_R9)(local_58,(long)local_48 - (long)local_58,in_stack_00000008), iVar3 < 0)) {
      in_RDI->encoded = -1;
      in_RDI->failed_type = in_RSI;
      in_RDI->structure_ptr = in_RDX;
      if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
        local_90 = "";
      }
      else {
        local_90 = in_RSI->name;
      }
      ASN_DEBUG("Failed to encode element %s",local_90);
      return in_RDI;
    }
    in_RDI->encoded = (ssize_t)(local_48 + ((long)local_60 - (long)local_58));
    in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
    in_RDI->structure_ptr = (void *)0x0;
  }
  return in_RDI;
}

Assistant:

asn_enc_rval_t
OCTET_STRING_encode_xer_utf8(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const OCTET_STRING_t *st = (const OCTET_STRING_t *)sptr;
	asn_enc_rval_t er;
	uint8_t *buf, *end;
	uint8_t *ss;	/* Sequence start */
	ssize_t encoded_len = 0;

	(void)ilevel;	/* Unused argument */
	(void)flags;	/* Unused argument */

	if(!st || (!st->buf && st->size))
		ASN__ENCODE_FAILED;

	buf = st->buf;
	end = buf + st->size;
	for(ss = buf; buf < end; buf++) {
		unsigned int ch = *buf;
		int s_len;	/* Special encoding sequence length */

		/*
		 * Escape certain characters: X.680/11.15
		 */
		if(ch < sizeof(OCTET_STRING__xer_escape_table)
			/sizeof(OCTET_STRING__xer_escape_table[0])
		&& (s_len = OCTET_STRING__xer_escape_table[ch].size)) {
			if(((buf - ss) && cb(ss, buf - ss, app_key) < 0)
			|| cb(OCTET_STRING__xer_escape_table[ch].string, s_len,
					app_key) < 0)
				ASN__ENCODE_FAILED;
			encoded_len += (buf - ss) + s_len;
			ss = buf + 1;
		}
	}

	encoded_len += (buf - ss);
	if((buf - ss) && cb(ss, buf - ss, app_key) < 0)
		ASN__ENCODE_FAILED;

	er.encoded = encoded_len;
	ASN__ENCODED_OK(er);
}